

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O3

void __thiscall TasGrid::GridSequence::setHierarchicalCoefficients(GridSequence *this,double *c)

{
  vector<int,_std::allocator<int>_> *__x;
  size_t sVar1;
  size_t sVar2;
  vector<double,_std::allocator<double>_> x;
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_68;
  size_t local_48;
  ulong local_40;
  vector<double,_std::allocator<double>_> local_38;
  
  clearGpuSurpluses(this);
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (this->super_BaseCanonicalGrid).points.cache_num_indexes =
         (this->super_BaseCanonicalGrid).needed.cache_num_indexes;
    (this->super_BaseCanonicalGrid).points.num_dimensions =
         (this->super_BaseCanonicalGrid).needed.num_dimensions;
    __x = &(this->super_BaseCanonicalGrid).needed.indexes;
    ::std::vector<int,_std::allocator<int>_>::operator=
              (&(this->super_BaseCanonicalGrid).points.indexes,__x);
    local_48 = 0;
    local_40 = local_40 & 0xffffffff00000000;
    local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (this->super_BaseCanonicalGrid).needed.cache_num_indexes = 0;
    (this->super_BaseCanonicalGrid).needed.num_dimensions = 0;
    ::std::vector<int,_std::allocator<int>_>::operator=
              (__x,(vector<int,_std::allocator<int>_> *)&local_38);
    if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])(this);
  }
  sVar2 = (size_t)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  sVar1 = (size_t)(this->super_BaseCanonicalGrid).num_outputs;
  ::std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_88,c,c + sVar1 * sVar2,
             (allocator_type *)&local_68);
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->surpluses).stride = sVar1;
  (this->surpluses).num_strips = sVar2;
  local_48 = sVar1;
  local_40 = sVar2;
  ::std::vector<double,_std::allocator<double>_>::operator=(&(this->surpluses).vec,&local_38);
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_88,(long)(this->super_BaseCanonicalGrid).num_dimensions * sVar2,
             (allocator_type *)&local_48);
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_68,(long)(this->super_BaseCanonicalGrid).num_outputs * sVar2,
             (allocator_type *)&local_48);
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0xb])
            (this,local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x13])
            (this,local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (ulong)(uint)(this->super_BaseCanonicalGrid).points.cache_num_indexes,
             local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_48 = (size_t)(this->super_BaseCanonicalGrid).num_outputs;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_BaseCanonicalGrid).values.num_outputs = local_48;
  (this->super_BaseCanonicalGrid).values.num_values = sVar2;
  local_40 = sVar2;
  ::std::vector<double,_std::allocator<double>_>::operator=
            (&(this->super_BaseCanonicalGrid).values.values,&local_38);
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridSequence::setHierarchicalCoefficients(const double c[]){
    clearGpuSurpluses(); // points have not changed, just clear surpluses
    if (!points.empty()){
        clearRefinement();
    }else{
        points = std::move(needed);
        needed = MultiIndexSet();
    }
    auto num_points = points.getNumIndexes();
    surpluses = Data2D<double>(num_outputs, num_points, std::vector<double>(c, c + Utils::size_mult(num_outputs, num_points)));

    std::vector<double> x(Utils::size_mult(num_dimensions, num_points));
    std::vector<double> y(Utils::size_mult(num_outputs,    num_points));

    getPoints(x.data());
    evaluateBatch(x.data(), points.getNumIndexes(), y.data()); // speed this up later

    values = StorageSet(num_outputs, num_points, std::move(y));
}